

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_tga.c
# Opt level: O0

int read_image_tga(gdIOCtx *ctx,oTga *tga)

{
  uint b;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  void *pvVar6;
  void *buf;
  int rle_size;
  int encoded_pixels;
  int i;
  int bitmap_caret;
  int buffer_caret;
  uchar *conversion_buffer;
  int *decompression_buffer;
  int image_block_size;
  int pixel_block_size;
  oTga *tga_local;
  gdIOCtx *ctx_local;
  
  b = tga->bits / 8;
  i = 0;
  encoded_pixels = 0;
  iVar1 = overflow2(tga->width,tga->height);
  if (iVar1 == 0) {
    iVar1 = overflow2(tga->width * tga->height,b);
    if (iVar1 == 0) {
      iVar1 = tga->width * tga->height * b;
      iVar2 = overflow2(iVar1,4);
      if (iVar2 == 0) {
        if ((tga->imagetype == '\x02') || (tga->imagetype == '\n')) {
          piVar5 = (int *)gdMalloc((long)iVar1 << 2);
          tga->bitmap = piVar5;
          if (tga->bitmap == (int *)0x0) {
            ctx_local._4_4_ = -1;
          }
          else {
            if (tga->imagetype == '\x02') {
              pvVar6 = gdMalloc((long)iVar1);
              if (pvVar6 == (void *)0x0) {
                return -1;
              }
              iVar2 = gdGetBuf(pvVar6,iVar1,ctx);
              if (iVar2 != iVar1) {
                gd_error("gd-tga: premature end of image data\n");
                gdFree(pvVar6);
                return -1;
              }
              for (; i < iVar1; i = i + 1) {
                tga->bitmap[i] = (uint)*(byte *)((long)pvVar6 + (long)i);
              }
              gdFree(pvVar6);
            }
            else if (tga->imagetype == '\n') {
              pvVar6 = gdMalloc((long)iVar1 << 2);
              if (pvVar6 == (void *)0x0) {
                return -1;
              }
              buf = gdMalloc((long)iVar1);
              if (buf == (void *)0x0) {
                gd_error("gd-tga: premature end of image data\n");
                gdFree(pvVar6);
                return -1;
              }
              iVar2 = gdGetBuf(buf,iVar1,ctx);
              if (iVar2 < 1) {
                gdFree(buf);
                gdFree(pvVar6);
                return -1;
              }
              for (i = 0; i < iVar2; i = i + 1) {
                *(uint *)((long)pvVar6 + (long)i * 4) = (uint)*(byte *)((long)buf + (long)i);
              }
              i = 0;
              while (encoded_pixels < iVar1) {
                if (iVar2 < (int)(i + b)) {
                  gdFree(pvVar6);
                  gdFree(buf);
                  return -1;
                }
                if ((*(uint *)((long)pvVar6 + (long)i * 4) & 0x80) == 0x80) {
                  iVar3 = (*(uint *)((long)pvVar6 + (long)i * 4) & 0xffffff7f) + 1;
                  iVar4 = i + 1;
                  if ((iVar1 < (int)(encoded_pixels + iVar3 * b)) || (iVar2 < (int)(iVar4 + b))) {
                    gdFree(pvVar6);
                    gdFree(buf);
                    return -1;
                  }
                  for (rle_size = 0; rle_size < iVar3; rle_size = rle_size + 1) {
                    memcpy(tga->bitmap + encoded_pixels,(void *)((long)pvVar6 + (long)iVar4 * 4),
                           (long)(int)b << 2);
                    encoded_pixels = b + encoded_pixels;
                  }
                  i = b + iVar4;
                }
                else {
                  iVar3 = *(int *)((long)pvVar6 + (long)i * 4) + 1;
                  iVar4 = i + 1;
                  if ((iVar1 < (int)(encoded_pixels + iVar3 * b)) ||
                     (iVar2 < (int)(iVar4 + iVar3 * b))) {
                    gdFree(pvVar6);
                    gdFree(buf);
                    return -1;
                  }
                  memcpy(tga->bitmap + encoded_pixels,(void *)((long)pvVar6 + (long)iVar4 * 4),
                         (long)(int)(iVar3 * b) << 2);
                  encoded_pixels = iVar3 * b + encoded_pixels;
                  i = iVar3 * b + iVar4;
                }
              }
              gdFree(pvVar6);
              gdFree(buf);
            }
            ctx_local._4_4_ = 1;
          }
        }
        else {
          ctx_local._4_4_ = -1;
        }
      }
      else {
        ctx_local._4_4_ = -1;
      }
    }
    else {
      ctx_local._4_4_ = -1;
    }
  }
  else {
    ctx_local._4_4_ = -1;
  }
  return ctx_local._4_4_;
}

Assistant:

int read_image_tga( gdIOCtx *ctx, oTga *tga )
{
	int pixel_block_size = (tga->bits / 8);
	int image_block_size;
	int* decompression_buffer = NULL;
	unsigned char* conversion_buffer = NULL;
	int buffer_caret = 0;
	int bitmap_caret = 0;
	int i = 0;
	int encoded_pixels;
	int rle_size;

	if(overflow2(tga->width, tga->height)) {
		return -1;
	}

	if(overflow2(tga->width * tga->height, pixel_block_size)) {
		return -1;
	}

	image_block_size = (tga->width * tga->height) * pixel_block_size;
	if(overflow2(image_block_size, sizeof(int))) {
		return -1;
	}

	/*! \todo Add more image type support.
	 */
	if (tga->imagetype != TGA_TYPE_RGB && tga->imagetype != TGA_TYPE_RGB_RLE)
		return -1;

	/*!	\brief Allocate memmory for image block
	 *  Allocate a chunk of memory for the image block to be passed into.
	 */
	tga->bitmap = (int *) gdMalloc(image_block_size * sizeof(int));
	if (tga->bitmap == NULL)
		return -1;

	switch (tga->imagetype) {
	case TGA_TYPE_RGB:
		/*! \brief Read in uncompressed RGB TGA
		 *  Chunk load the pixel data from an uncompressed RGB type TGA.
		 */
		conversion_buffer = (unsigned char *) gdMalloc(image_block_size * sizeof(unsigned char));
		if (conversion_buffer == NULL) {
			return -1;
		}

		if (gdGetBuf(conversion_buffer, image_block_size, ctx) != image_block_size) {
			gd_error("gd-tga: premature end of image data\n");
			gdFree(conversion_buffer);
			return -1;
		}

		while (buffer_caret < image_block_size) {
			tga->bitmap[buffer_caret] = (int) conversion_buffer[buffer_caret];
			buffer_caret++;
		}

		gdFree(conversion_buffer);
		break;

	case TGA_TYPE_RGB_RLE:
		/*! \brief Read in RLE compressed RGB TGA
		 *  Chunk load the pixel data from an RLE compressed RGB type TGA.
		 */
		decompression_buffer = (int*) gdMalloc(image_block_size * sizeof(int));
		if (decompression_buffer == NULL) {
			return -1;
		}
		conversion_buffer = (unsigned char *) gdMalloc(image_block_size * sizeof(unsigned char));
		if (conversion_buffer == NULL) {
			gd_error("gd-tga: premature end of image data\n");
			gdFree( decompression_buffer );
			return -1;
		}

		rle_size = gdGetBuf(conversion_buffer, image_block_size, ctx);
		if (rle_size <= 0) {
			gdFree(conversion_buffer);
			gdFree(decompression_buffer);
			return -1;
		}

		buffer_caret = 0;

		while( buffer_caret < rle_size) {
			decompression_buffer[buffer_caret] = (int)conversion_buffer[buffer_caret];
			buffer_caret++;
		}

		buffer_caret = 0;

		while( bitmap_caret < image_block_size ) {

			if (buffer_caret + pixel_block_size > rle_size) {
				gdFree( decompression_buffer );
				gdFree( conversion_buffer );
				return -1;
			}

			if ((decompression_buffer[buffer_caret] & TGA_RLE_FLAG) == TGA_RLE_FLAG) {
				encoded_pixels = ( ( decompression_buffer[ buffer_caret ] & ~TGA_RLE_FLAG ) + 1 );
				buffer_caret++;

				if ((bitmap_caret + (encoded_pixels * pixel_block_size)) > image_block_size
						|| buffer_caret + pixel_block_size > rle_size) {
					gdFree( decompression_buffer );
					gdFree( conversion_buffer );
					return -1;
				}

				for (i = 0; i < encoded_pixels; i++) {
					memcpy(tga->bitmap + bitmap_caret, decompression_buffer + buffer_caret, pixel_block_size * sizeof(int));
					bitmap_caret += pixel_block_size;
				}
				buffer_caret += pixel_block_size;

			} else {
				encoded_pixels = decompression_buffer[ buffer_caret ] + 1;
				buffer_caret++;

				if ((bitmap_caret + (encoded_pixels * pixel_block_size)) > image_block_size
						|| buffer_caret + (encoded_pixels * pixel_block_size) > rle_size) {
					gdFree( decompression_buffer );
					gdFree( conversion_buffer );
					return -1;
				}

				memcpy(tga->bitmap + bitmap_caret, decompression_buffer + buffer_caret, encoded_pixels * pixel_block_size * sizeof(int));
				bitmap_caret += (encoded_pixels * pixel_block_size);
				buffer_caret += (encoded_pixels * pixel_block_size);
			}
		}
		gdFree( decompression_buffer );
		gdFree( conversion_buffer );
		break;
	}

	return 1;
}